

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uppity.c
# Opt level: O0

_Bool longoptarg(char *arg,char *expected,char **val,int *argcp,char ***argvp)

{
  char **ppcVar1;
  int iVar2;
  int iVar3;
  size_t sVar4;
  int len;
  char ***argvp_local;
  int *argcp_local;
  char **val_local;
  char *expected_local;
  char *arg_local;
  
  sVar4 = strlen(expected);
  iVar2 = (int)sVar4;
  iVar3 = memcmp(arg,expected,(long)iVar2);
  if (iVar3 == 0) {
    if (arg[iVar2] == '=') {
      *val = arg + (long)iVar2 + 1;
      arg_local._7_1_ = true;
    }
    else if (arg[iVar2] == '\0') {
      iVar2 = *argcp;
      *argcp = iVar2 + -1;
      if (iVar2 + -1 < 1) {
        fprintf(_stderr,"%s: option %s expects an argument\n","Uppity",expected);
        exit(1);
      }
      ppcVar1 = *argvp;
      *argvp = ppcVar1 + 1;
      *val = ppcVar1[1];
      arg_local._7_1_ = true;
    }
    else {
      arg_local._7_1_ = false;
    }
  }
  else {
    arg_local._7_1_ = false;
  }
  return arg_local._7_1_;
}

Assistant:

static bool longoptarg(const char *arg, const char *expected,
                       const char **val, int *argcp, char ***argvp)
{
    int len = strlen(expected);
    if (memcmp(arg, expected, len))
        return false;
    if (arg[len] == '=') {
        *val = arg + len + 1;
        return true;
    } else if (arg[len] == '\0') {
        if (--*argcp > 0) {
            *val = *++*argvp;
            return true;
        } else {
            fprintf(stderr, "%s: option %s expects an argument\n",
                    appname, expected);
            exit(1);
        }
    }
    return false;
}